

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haptic.c
# Opt level: O0

_Bool al_install_haptic(void)

{
  _Bool _Var1;
  ALLEGRO_SYSTEM *func;
  ALLEGRO_HAPTIC_DRIVER *desc;
  ALLEGRO_HAPTIC_DRIVER *hapdrv;
  ALLEGRO_SYSTEM *sysdrv;
  _Bool local_1;
  
  if (haptic_driver == (ALLEGRO_HAPTIC_DRIVER *)0x0) {
    func = al_get_system_driver();
    if (((func->vt->get_haptic_driver == (_func_ALLEGRO_HAPTIC_DRIVER_ptr *)0x0) ||
        (desc = (*func->vt->get_haptic_driver)(), desc == (ALLEGRO_HAPTIC_DRIVER *)0x0)) ||
       (_Var1 = (*desc->init_haptic)(), !_Var1)) {
      local_1 = false;
    }
    else {
      haptic_driver = desc;
      _al_add_exit_func((_func_void *)func,(char *)desc);
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool al_install_haptic(void)
{
   ALLEGRO_SYSTEM *sysdrv;
   ALLEGRO_HAPTIC_DRIVER *hapdrv;

   if (haptic_driver)
      return true;

   sysdrv = al_get_system_driver();
   ASSERT(sysdrv);

   /* Currently every platform only has at most one haptic driver. */
   if (sysdrv->vt->get_haptic_driver) {
      hapdrv = sysdrv->vt->get_haptic_driver();
      /* Avoid race condition in case the haptic driver generates an
       * event right after ->init_haptic.
       */
      if (hapdrv && hapdrv->init_haptic()) {
         haptic_driver = hapdrv;
         _al_add_exit_func(al_uninstall_haptic, "al_uninstall_haptic");
         return true;
      }
   }

   return false;
}